

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

int AF_AActor_RemoveInventory
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  PClass *pPVar1;
  PClass *pPVar2;
  long *plVar3;
  char *pcVar4;
  undefined8 *puVar5;
  bool bVar6;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_0042c973;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_0042c95a:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_0042c973:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x35b,
                  "int AF_AActor_RemoveInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  plVar3 = (long *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (plVar3 == (long *)0x0) goto LAB_0042c89d;
    pPVar1 = (PClass *)plVar3[1];
    if (pPVar1 == (PClass *)0x0) {
      pPVar1 = (PClass *)(**(code **)*plVar3)(plVar3);
      plVar3[1] = (long)pPVar1;
    }
    bVar6 = pPVar1 != (PClass *)0x0;
    if (pPVar1 != pPVar2 && bVar6) {
      do {
        pPVar1 = pPVar1->ParentClass;
        bVar6 = pPVar1 != (PClass *)0x0;
        if (pPVar1 == pPVar2) break;
      } while (pPVar1 != (PClass *)0x0);
    }
    if (!bVar6) {
      pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0042c973;
    }
  }
  else {
    if (plVar3 != (long *)0x0) goto LAB_0042c95a;
LAB_0042c89d:
    plVar3 = (long *)0x0;
  }
  if (numparam == 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_0042c992;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_0042c963:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_0042c992;
  }
  puVar5 = (undefined8 *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (puVar5 == (undefined8 *)0x0) goto LAB_0042c8ce;
  }
  else {
    if (puVar5 != (undefined8 *)0x0) goto LAB_0042c963;
LAB_0042c8ce:
    NullParam("\"item\"");
    puVar5 = (undefined8 *)param[1].field_0.field_1.a;
    if (puVar5 == (undefined8 *)0x0) {
      puVar5 = (undefined8 *)0x0;
      goto LAB_0042c93e;
    }
  }
  pPVar1 = AInventory::RegistrationInfo.MyClass;
  pPVar2 = (PClass *)puVar5[1];
  if (pPVar2 == (PClass *)0x0) {
    pPVar2 = (PClass *)(**(code **)*puVar5)(puVar5);
    puVar5[1] = pPVar2;
  }
  bVar6 = pPVar2 != (PClass *)0x0;
  if (pPVar2 != pPVar1 && bVar6) {
    do {
      pPVar2 = pPVar2->ParentClass;
      bVar6 = pPVar2 != (PClass *)0x0;
      if (pPVar2 == pPVar1) break;
    } while (pPVar2 != (PClass *)0x0);
  }
  if (!bVar6) {
    pcVar4 = "item == NULL || item->IsKindOf(RUNTIME_CLASS(AInventory))";
LAB_0042c992:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x35c,
                  "int AF_AActor_RemoveInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_0042c93e:
  (**(code **)(*plVar3 + 0xa8))(plVar3,puVar5);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, RemoveInventory)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT_NOT_NULL(item, AInventory);
	self->RemoveInventory(item);
	return 0;
}